

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

InsertionOrderIndex * __thiscall
kj::InsertionOrderIndex::operator=(InsertionOrderIndex *this,InsertionOrderIndex *other)

{
  this->capacity = other->capacity;
  this->links = other->links;
  other->capacity = 0;
  other->links = (Link *)&EMPTY_LINK;
  return this;
}

Assistant:

InsertionOrderIndex& InsertionOrderIndex::operator=(InsertionOrderIndex&& other) {
  KJ_DASSERT(&other != this);
  capacity = other.capacity;
  links = other.links;
  other.capacity = 0;
  other.links = const_cast<Link*>(&EMPTY_LINK);
  return *this;
}